

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

void __thiscall MeCab::FreeList<mecab_path_t>::~FreeList(FreeList<mecab_path_t> *this)

{
  ulong uVar1;
  pointer ppmVar2;
  
  this->_vptr_FreeList = (_func_int **)&PTR__FreeList_0019e120;
  this->li_ = 0;
  ppmVar2 = (this->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppmVar2) {
    uVar1 = 0;
    do {
      if (ppmVar2[uVar1] != (mecab_path_t *)0x0) {
        operator_delete__(ppmVar2[uVar1]);
      }
      uVar1 = this->li_ + 1;
      this->li_ = uVar1;
      ppmVar2 = (this->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar1 < (ulong)((long)(this->freeList).
                                   super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppmVar2 >> 3))
    ;
  }
  if (ppmVar2 != (pointer)0x0) {
    operator_delete(ppmVar2);
    return;
  }
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }